

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O1

vec<3,_unsigned_int,_(glm::qualifier)0> __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::getValue
          (ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this,size_t ind)

{
  undefined8 *puVar1;
  pointer pvVar2;
  undefined4 uVar3;
  pointer pvVar4;
  undefined4 uVar5;
  bool bVar6;
  vec<3,_unsigned_int,_(glm::qualifier)0> vVar7;
  char cVar8;
  char cVar9;
  CanonicalDataSource CVar10;
  ulong uVar11;
  long *plVar12;
  undefined8 *puVar13;
  ulong *puVar14;
  size_type *psVar15;
  size_t sVar16;
  ulong uVar17;
  _Alloc_hider _Var18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  uvec3 uVar20;
  vec<3,_unsigned_int,_(glm::qualifier)0> vVar21;
  ulong *local_108;
  uint local_100;
  undefined4 uStack_fc;
  ulong local_f8 [2];
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  undefined8 uVar22;
  anon_union_4_3_4e909dac_for_vec<3,_unsigned_int,_(glm::qualifier)0>_7 aVar23;
  
  if (this->deviceBufferType - Texture1d < 3) {
    ensureHostBufferPopulated(this);
  }
  CVar10 = currentCanonicalDataSource(this);
  if (CVar10 != RenderBuffer) {
    if (CVar10 == NeedsCompute) {
      if ((this->computeFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->computeFunc)._M_invoker)((_Any_data *)&this->computeFunc);
      uVar11 = ((long)(this->data->
                      super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->data->
                      super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      if (ind <= uVar11 && uVar11 - ind != 0) goto LAB_00227496;
      std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
      puVar14 = puVar13 + 2;
      if ((ulong *)*puVar13 == puVar14) {
        local_b8 = *puVar14;
        lStack_b0 = puVar13[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar14;
        local_c8 = (ulong *)*puVar13;
      }
      local_c0 = puVar13[1];
      *puVar13 = puVar14;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      cVar9 = '\x01';
      if (9 < ind) {
        sVar16 = ind;
        cVar8 = '\x04';
        do {
          cVar9 = cVar8;
          if (sVar16 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_0022730b;
          }
          if (sVar16 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_0022730b;
          }
          if (sVar16 < 10000) goto LAB_0022730b;
          bVar6 = 99999 < sVar16;
          sVar16 = sVar16 / 10000;
          cVar8 = cVar9 + '\x04';
        } while (bVar6);
        cVar9 = cVar9 + '\x01';
      }
LAB_0022730b:
      local_108 = local_f8;
      std::__cxx11::string::_M_construct((ulong)&local_108,cVar9);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108,local_100,ind);
      uVar11 = CONCAT44(uStack_fc,local_100) + local_c0;
      uVar17 = 0xf;
      if (local_c8 != &local_b8) {
        uVar17 = local_b8;
      }
      if (uVar17 < uVar11) {
        uVar17 = 0xf;
        if (local_108 != local_f8) {
          uVar17 = local_f8[0];
        }
        if (uVar17 < uVar11) goto LAB_0022736d;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_0022736d:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_108);
      }
      local_e8 = &local_d8;
      puVar1 = puVar13 + 2;
      if ((undefined8 *)*puVar13 == puVar1) {
        local_d8 = *puVar1;
        uStack_d0 = puVar13[3];
      }
      else {
        local_d8 = *puVar1;
        local_e8 = (undefined8 *)*puVar13;
      }
      local_e0 = puVar13[1];
      *puVar13 = puVar1;
      puVar13[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_e8);
      paVar19 = &local_68.field_2;
      psVar15 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_68.field_2._M_allocated_capacity = *psVar15;
        local_68.field_2._8_8_ = plVar12[3];
        local_68._M_dataplus._M_p = (pointer)paVar19;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar15;
        local_68._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_68._M_string_length = plVar12[1];
      *plVar12 = (long)psVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      exception(&local_68);
      _Var18._M_p = local_68._M_dataplus._M_p;
    }
    else {
      if (CVar10 != HostData) {
        return (vec<3,_unsigned_int,_(glm::qualifier)0>)ZEXT812(0);
      }
      uVar11 = ((long)(this->data->
                      super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->data->
                      super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      if (ind <= uVar11 && uVar11 - ind != 0) goto LAB_00227496;
      std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_a8);
      puVar14 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar14) {
        local_b8 = *puVar14;
        lStack_b0 = plVar12[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar14;
        local_c8 = (ulong *)*plVar12;
      }
      local_c0 = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      cVar9 = '\x01';
      if (9 < ind) {
        sVar16 = ind;
        cVar8 = '\x04';
        do {
          cVar9 = cVar8;
          if (sVar16 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_002271c6;
          }
          if (sVar16 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_002271c6;
          }
          if (sVar16 < 10000) goto LAB_002271c6;
          bVar6 = 99999 < sVar16;
          sVar16 = sVar16 / 10000;
          cVar8 = cVar9 + '\x04';
        } while (bVar6);
        cVar9 = cVar9 + '\x01';
      }
LAB_002271c6:
      local_108 = local_f8;
      std::__cxx11::string::_M_construct((ulong)&local_108,cVar9);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108,local_100,ind);
      uVar11 = CONCAT44(uStack_fc,local_100) + local_c0;
      uVar17 = 0xf;
      if (local_c8 != &local_b8) {
        uVar17 = local_b8;
      }
      if (uVar17 < uVar11) {
        uVar17 = 0xf;
        if (local_108 != local_f8) {
          uVar17 = local_f8[0];
        }
        if (uVar17 < uVar11) goto LAB_00227228;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_00227228:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_108);
      }
      local_e8 = &local_d8;
      puVar1 = puVar13 + 2;
      if ((undefined8 *)*puVar13 == puVar1) {
        local_d8 = *puVar1;
        uStack_d0 = puVar13[3];
      }
      else {
        local_d8 = *puVar1;
        local_e8 = (undefined8 *)*puVar13;
      }
      local_e0 = puVar13[1];
      *puVar13 = puVar1;
      puVar13[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_e8);
      paVar19 = &local_48.field_2;
      psVar15 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_48.field_2._M_allocated_capacity = *psVar15;
        local_48.field_2._8_8_ = plVar12[3];
        local_48._M_dataplus._M_p = (pointer)paVar19;
      }
      else {
        local_48.field_2._M_allocated_capacity = *psVar15;
        local_48._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_48._M_string_length = plVar12[1];
      *plVar12 = (long)psVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      exception(&local_48);
      _Var18._M_p = local_48._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var18._M_p != paVar19) {
      operator_delete(_Var18._M_p);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    if (local_108 != local_f8) {
      operator_delete(local_108);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
LAB_00227496:
    pvVar4 = (this->data->
             super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = pvVar4 + ind;
    uVar3 = pvVar2->field_0;
    uVar5 = pvVar2->field_1;
    vVar7.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_unsigned_int,_(glm::qualifier)0>_5)uVar5;
    vVar7.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_unsigned_int,_(glm::qualifier)0>_3)uVar3;
    vVar7.field_2.z = pvVar4[ind].field_2.z;
    return vVar7;
  }
  if ((long)ind <
      ((this->renderAttributeBuffer).
       super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      dataSize) goto LAB_002271b3;
  std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_a8);
  puVar14 = (ulong *)(plVar12 + 2);
  if ((ulong *)*plVar12 == puVar14) {
    local_b8 = *puVar14;
    lStack_b0 = plVar12[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar14;
    local_c8 = (ulong *)*plVar12;
  }
  local_c0 = plVar12[1];
  *plVar12 = (long)puVar14;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  cVar9 = '\x01';
  if (9 < ind) {
    sVar16 = ind;
    cVar8 = '\x04';
    do {
      cVar9 = cVar8;
      if (sVar16 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_00227028;
      }
      if (sVar16 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_00227028;
      }
      if (sVar16 < 10000) goto LAB_00227028;
      bVar6 = 99999 < sVar16;
      sVar16 = sVar16 / 10000;
      cVar8 = cVar9 + '\x04';
    } while (bVar6);
    cVar9 = cVar9 + '\x01';
  }
LAB_00227028:
  local_108 = local_f8;
  std::__cxx11::string::_M_construct((ulong)&local_108,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_108,local_100,ind);
  uVar11 = CONCAT44(uStack_fc,local_100) + local_c0;
  uVar17 = 0xf;
  if (local_c8 != &local_b8) {
    uVar17 = local_b8;
  }
  if (uVar17 < uVar11) {
    uVar17 = 0xf;
    if (local_108 != local_f8) {
      uVar17 = local_f8[0];
    }
    if (uVar17 < uVar11) goto LAB_0022708a;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_0022708a:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_108);
  }
  local_e8 = &local_d8;
  puVar1 = puVar13 + 2;
  if ((undefined8 *)*puVar13 == puVar1) {
    local_d8 = *puVar1;
    uStack_d0 = puVar13[3];
  }
  else {
    local_d8 = *puVar1;
    local_e8 = (undefined8 *)*puVar13;
  }
  local_e0 = puVar13[1];
  *puVar13 = puVar1;
  puVar13[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_e8);
  psVar15 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_88.field_2._M_allocated_capacity = *psVar15;
    local_88.field_2._8_8_ = plVar12[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar15;
    local_88._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_88._M_string_length = plVar12[1];
  *plVar12 = (long)psVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  exception(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
LAB_002271b3:
  uVar20 = getAttributeBufferData<glm::vec<3,unsigned_int,(glm::qualifier)0>>
                     ((this->renderAttributeBuffer).
                      super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,ind);
  vVar21.field_0 = uVar20.field_0;
  uVar22._4_4_ = uVar20.field_1;
  register0x00000010 = uVar20.field_2;
  return vVar21;
}

Assistant:

T ManagedBuffer<T>::getValue(size_t ind) {

  // For the texture case, always copy to the host and pull from there
  if (deviceBufferTypeIsTexture()) {
    ensureHostBufferPopulated();
  }

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::NeedsCompute:
    computeFunc();
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::RenderBuffer:

    // NOTE: right now this case should never happen unless deviceBufferType == DeviceBufferType::Attribute.
    // In the texture case, we cannot get a single pixel from the backend anyway, so we always
    // call ensureHostBufferPopulated() above and do the host access.

    if (static_cast<int64_t>(ind) >= renderAttributeBuffer->getDataSize())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");

    T val = getAttributeBufferData<T>(*renderAttributeBuffer, ind);
    return val;
    break;
  };

  return T(); // dummy return
}